

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rewrite.h
# Opt level: O0

PatternPtr __thiscall trieste::detail::Inside<2UL>::custom_rep(Inside<2UL> *this)

{
  bool bVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  PatternDef *in_RSI;
  PatternPtr PVar3;
  array<trieste::Token,_2UL> local_28;
  Inside<2UL> *this_local;
  
  this_local = this;
  bVar1 = PatternDef::no_continuation(in_RSI);
  if (bVar1) {
    std::make_shared<trieste::detail::InsideStar<2ul>,std::array<trieste::Token,2ul>&>(&local_28);
    std::shared_ptr<trieste::detail::PatternDef>::shared_ptr<trieste::detail::InsideStar<2ul>,void>
              ((shared_ptr<trieste::detail::PatternDef> *)this,
               (shared_ptr<trieste::detail::InsideStar<2UL>_> *)&local_28);
    std::shared_ptr<trieste::detail::InsideStar<2UL>_>::~shared_ptr
              ((shared_ptr<trieste::detail::InsideStar<2UL>_> *)&local_28);
    _Var2._M_pi = extraout_RDX;
  }
  else {
    CLI::std::shared_ptr<trieste::detail::PatternDef>::shared_ptr
              ((shared_ptr<trieste::detail::PatternDef> *)this);
    _Var2._M_pi = extraout_RDX_00;
  }
  PVar3.super___shared_ptr<trieste::detail::PatternDef,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = _Var2._M_pi;
  PVar3.super___shared_ptr<trieste::detail::PatternDef,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       &this->super_PatternDef;
  return (PatternPtr)
         PVar3.super___shared_ptr<trieste::detail::PatternDef,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

PatternPtr custom_rep() override
      {
        // Rep(Inside) -> InsideStar
        if (no_continuation())
          return std::make_shared<InsideStar<N>>(types);
        return {};
      }